

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O0

void __thiscall
crnlib::mip_level::assign
          (mip_level *this,dxt_image *p,pixel_format fmt,orientation_flags_t orient_flags)

{
  uint uVar1;
  dxt_format dxt_fmt;
  pixel_format pVar2;
  component_flags cVar3;
  orientation_flags_t in_ECX;
  pixel_format in_EDX;
  dxt_image *in_RSI;
  mip_level *in_RDI;
  
  clear(in_RDI);
  in_RDI->m_pDXTImage = in_RSI;
  uVar1 = dxt_image::get_width(in_RSI);
  in_RDI->m_width = uVar1;
  uVar1 = dxt_image::get_height(in_RSI);
  in_RDI->m_height = uVar1;
  in_RDI->m_orient_flags = in_ECX;
  if (in_EDX == PIXEL_FMT_INVALID) {
    dxt_fmt = dxt_image::get_format(in_RSI);
    pVar2 = pixel_format_helpers::from_dxt_format(dxt_fmt);
    in_RDI->m_format = pVar2;
  }
  else {
    in_RDI->m_format = in_EDX;
  }
  cVar3 = pixel_format_helpers::get_component_flags(in_RDI->m_format);
  in_RDI->m_comp_flags = cVar3;
  return;
}

Assistant:

void mip_level::assign(dxt_image* p, pixel_format fmt, orientation_flags_t orient_flags) {
  CRNLIB_ASSERT(p);

  clear();

  m_pDXTImage = p;

  m_width = p->get_width();
  m_height = p->get_height();
  m_orient_flags = orient_flags;

  if (fmt != PIXEL_FMT_INVALID)
    m_format = fmt;
  else
    m_format = pixel_format_helpers::from_dxt_format(p->get_format());

  m_comp_flags = pixel_format_helpers::get_component_flags(m_format);
}